

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tables.cpp
# Opt level: O2

void __thiscall CLabelTable::Dump(CLabelTable *this)

{
  char cVar1;
  char *pcVar2;
  FILE *__stream;
  mapped_type *pmVar3;
  size_t sVar4;
  key_type *name;
  pointer __k;
  char *local_858;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  order;
  char line [2048];
  
  __stream = (FILE *)GetListingFile();
  if (__stream != (FILE *)0x0) {
    getDumpOrder(&order,&this->symbols);
    fputs("\nValue    Label\n",__stream);
    fputs("------ - -----------------------------------------------------------\n",__stream);
    for (__k = order.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        __k != order.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SLabelTableEntry>_>_>
               ::at(&this->symbols,__k);
      if (pmVar3->page != -1) {
        line[0] = '0';
        line[1] = 'x';
        local_858 = line + 2;
        PrintHexAlt(&local_858,pmVar3->value);
        pcVar2 = local_858 + 1;
        *local_858 = ' ';
        local_858 = pcVar2;
        cVar1 = 'X';
        if (pmVar3->used != false) {
          cVar1 = ' ';
        }
        pcVar2 = local_858 + 1;
        *local_858 = cVar1;
        local_858 = pcVar2;
        pcVar2 = local_858 + 1;
        *local_858 = ' ';
        local_858 = pcVar2;
        strncpy(local_858,(__k->_M_dataplus)._M_p,(size_t)(line + (0x7fe - (long)local_858)));
        pcVar2 = local_858;
        sVar4 = strlen(local_858);
        (pcVar2 + sVar4)[0] = '\n';
        (pcVar2 + sVar4)[1] = '\0';
        fputs(line,__stream);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&order);
  }
  return;
}

Assistant:

void CLabelTable::Dump() {
	FILE* listFile = GetListingFile();
	if (NULL == listFile) return;		// listing file must be already opened here

	const auto order = getDumpOrder(symbols);

	char line[LINEMAX], *ep;
	fputs("\nValue    Label\n", listFile);
	fputs("------ - -----------------------------------------------------------\n", listFile);
	for (const symbol_map_t::key_type& name: order) {
		const symbol_map_t::mapped_type& symbol = symbols.at(name);
		if (LABEL_PAGE_UNDEFINED == symbol.page) continue;
		ep = line;
		*(ep) = 0;
		*(ep++) = '0';
		*(ep++) = 'x';
		PrintHexAlt(ep, symbol.value);
		*(ep++) = ' ';
		*(ep++) = symbol.used ? ' ' : 'X';
		*(ep++) = ' ';
		STRNCPY(ep, LINEMAX, name.c_str(), LINEMAX - (ep - line) - 2);
		STRNCAT(ep, LINEMAX, "\n", 2);
		fputs(line, listFile);
	}
}